

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall
slang::ast::Scope::addWildcardImport
          (Scope *this,PackageImportItemSyntax *item,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes)

{
  WildcardImportData *pWVar1;
  pointer ppWVar2;
  size_t __n;
  char *__s1;
  Compilation *this_00;
  int iVar3;
  SourceLocation location;
  Diagnostic *this_01;
  WildcardImportSymbol *pWVar4;
  pointer ppWVar5;
  bool bVar6;
  bool bVar7;
  string_view sVar8;
  SourceLocation local_48;
  string_view local_40;
  
  pWVar1 = this->importData;
  if (pWVar1 != (WildcardImportData *)0x0) {
    ppWVar5 = (pWVar1->wildcardImports).
              super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppWVar2 = (pWVar1->wildcardImports).
              super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = ppWVar5 == ppWVar2;
    if (!bVar6) {
      do {
        pWVar4 = *ppWVar5;
        __n = (pWVar4->packageName)._M_len;
        __s1 = (pWVar4->packageName)._M_str;
        sVar8 = parsing::Token::valueText(&item->package);
        if (__n == sVar8._M_len) {
          if (__n == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp(__s1,sVar8._M_str,__n);
            bVar7 = iVar3 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          if ((pWVar4->packageName)._M_len != 0) {
            location = parsing::Token::location(&item->item);
            this_01 = addDiag(this,(DiagCode)0x41000a,location);
            Diagnostic::addNote(this_01,(DiagCode)0xa0001,(pWVar4->super_Symbol).location);
          }
          if (bVar7) {
            if (!bVar6) {
              return;
            }
            break;
          }
        }
        ppWVar5 = ppWVar5 + 1;
        bVar6 = ppWVar5 == ppWVar2;
      } while (!bVar6);
    }
  }
  this_00 = this->compilation;
  local_40 = parsing::Token::valueText(&item->package);
  local_48 = parsing::Token::location(&item->item);
  pWVar4 = BumpAllocator::
           emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&this_00->super_BumpAllocator,&local_40,&local_48);
  (pWVar4->super_Symbol).originatingSyntax = &item->super_SyntaxNode;
  Symbol::setAttributes(&pWVar4->super_Symbol,this,attributes);
  insertMember(this,&pWVar4->super_Symbol,this->lastMember,false,true);
  addWildcardImport(this,pWVar4);
  return;
}

Assistant:

void Scope::addWildcardImport(const PackageImportItemSyntax& item,
                              std::span<const AttributeInstanceSyntax* const> attributes) {
    if (importData) {
        // Check for redundant import statements.
        for (auto import : importData->wildcardImports) {
            if (import->packageName == item.package.valueText()) {
                if (!import->packageName.empty()) {
                    auto& diag = addDiag(diag::DuplicateImport, item.item.location());
                    diag.addNote(diag::NotePreviousDefinition, import->location);
                }
                return;
            }
        }
    }

    auto import = compilation.emplace<WildcardImportSymbol>(item.package.valueText(),
                                                            item.item.location());

    import->setSyntax(item);
    import->setAttributes(*this, attributes);
    addMember(*import);
    addWildcardImport(*import);
}